

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

PackageSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PackageSymbol,slang::ast::Compilation&,char_const(&)[4],slang::SourceLocation_const&,slang::ast::NetType_const&,slang::ast::VariableLifetime>
          (BumpAllocator *this,Compilation *args,char (*args_1) [4],SourceLocation *args_2,
          NetType *args_3,VariableLifetime *args_4)

{
  size_t sVar1;
  PackageSymbol *this_00;
  string_view name;
  
  this_00 = (PackageSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PackageSymbol *)this->endPtr < this_00 + 1) {
    this_00 = (PackageSymbol *)allocateSlow(this,0xa8,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  sVar1 = strlen(*args_1);
  name._M_str = *args_1;
  name._M_len = sVar1;
  ast::PackageSymbol::PackageSymbol(this_00,args,name,*args_2,args_3,*args_4);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }